

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O0

void __thiscall
myvk::QueueSelectionResolver::FetchDeviceQueues(QueueSelectionResolver *this,Ptr<Device> *device)

{
  QueueSelection *this_00;
  bool bVar1;
  Ptr<Surface> *surface;
  Ptr<Surface> *pPVar2;
  reference ppQVar3;
  long in_RDI;
  QueueSelection *selection;
  const_iterator __end3;
  const_iterator __begin3;
  value_type *__range3;
  Ptr<UniqueQueue> unique_queue;
  uint32_t index;
  uint32_t family;
  pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>
  *creation;
  const_iterator __end1;
  const_iterator __begin1;
  map<unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>_>_>
  *__range1;
  map<unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>_>_>
  *in_stack_ffffffffffffff38;
  shared_ptr<myvk::PresentQueue> *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff58;
  Ptr<UniqueQueue> *in_stack_ffffffffffffff68;
  uint32_t in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff84;
  Ptr<Device> *in_stack_ffffffffffffff88;
  __normal_iterator<myvk::QueueSelection_*const_*,_std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>
  local_58;
  const_reference local_50;
  uint local_38;
  uint local_34;
  reference local_30;
  _Self local_28;
  _Self local_20;
  long local_18;
  
  local_18 = in_RDI + 0x18;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>_>_>
       ::begin(in_stack_ffffffffffffff38);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>_>_>
       ::end(in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = std::operator==(&local_20,&local_28);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_30 = std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>_>
                            *)0x2b4f82);
    local_34 = local_30->first;
    local_38 = 0;
    while( true ) {
      surface = (Ptr<Surface> *)(ulong)local_38;
      pPVar2 = (Ptr<Surface> *)
               std::
               vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>
               ::size(&local_30->second);
      if (pPVar2 <= surface) break;
      UniqueQueue::Create(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                          in_stack_ffffffffffffff80);
      local_50 = std::
                 vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>
                 ::operator[](&local_30->second,(ulong)local_38);
      local_58._M_current =
           (QueueSelection **)
           std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>::begin
                     ((vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_> *)
                      in_stack_ffffffffffffff38);
      std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>::end
                ((vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_> *)
                 in_stack_ffffffffffffff38);
      while( true ) {
        bVar1 = __gnu_cxx::
                operator==<myvk::QueueSelection_*const_*,_std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>
                          ((__normal_iterator<myvk::QueueSelection_*const_*,_std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>
                            *)in_stack_ffffffffffffff40,
                           (__normal_iterator<myvk::QueueSelection_*const_*,_std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>
                            *)in_stack_ffffffffffffff38);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        ppQVar3 = __gnu_cxx::
                  __normal_iterator<myvk::QueueSelection_*const_*,_std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>
                  ::operator*(&local_58);
        this_00 = *ppQVar3;
        bVar1 = QueueSelection::IsPresentQueue((QueueSelection *)0x2b506a);
        if (bVar1) {
          QueueSelection::GetSurfacePtr(this_00);
          PresentQueue::Create(in_stack_ffffffffffffff68,surface);
          QueueSelection::GetPresentQueueTargetRef(this_00);
          std::shared_ptr<myvk::PresentQueue>::operator=
                    (in_stack_ffffffffffffff40,
                     (shared_ptr<myvk::PresentQueue> *)in_stack_ffffffffffffff38);
          std::shared_ptr<myvk::PresentQueue>::~shared_ptr
                    ((shared_ptr<myvk::PresentQueue> *)0x2b50d1);
        }
        else {
          Queue::Create((Ptr<UniqueQueue> *)CONCAT17(bVar1,in_stack_ffffffffffffff58));
          in_stack_ffffffffffffff40 =
               (shared_ptr<myvk::PresentQueue> *)QueueSelection::GetQueueTargetRef(this_00);
          std::shared_ptr<myvk::Queue>::operator=
                    ((shared_ptr<myvk::Queue> *)in_stack_ffffffffffffff40,
                     (shared_ptr<myvk::Queue> *)in_stack_ffffffffffffff38);
          std::shared_ptr<myvk::Queue>::~shared_ptr((shared_ptr<myvk::Queue> *)0x2b5144);
        }
        __gnu_cxx::
        __normal_iterator<myvk::QueueSelection_*const_*,_std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>
        ::operator++(&local_58);
      }
      std::shared_ptr<myvk::UniqueQueue>::~shared_ptr((shared_ptr<myvk::UniqueQueue> *)0x2b517e);
      local_38 = local_38 + 1;
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>_>
                  *)in_stack_ffffffffffffff40);
  }
  return;
}

Assistant:

void QueueSelectionResolver::FetchDeviceQueues(const Ptr<Device> &device) const {
	for (const auto &creation : m_queue_creations) {
		uint32_t family = creation.first;
		for (uint32_t index = 0; index < creation.second.size(); ++index) {
			Ptr<UniqueQueue> unique_queue = UniqueQueue::Create(device, family, index);
			for (QueueSelection *selection : creation.second[index]) {
				if (selection->IsPresentQueue())
					selection->GetPresentQueueTargetRef() =
					    PresentQueue::Create(unique_queue, selection->GetSurfacePtr());
				else {
					selection->GetQueueTargetRef() = Queue::Create(unique_queue);
				}
			}
		}
	}
}